

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  byte bVar1;
  u8 *puVar2;
  ushort uVar3;
  u8 uVar4;
  uint uVar5;
  int iVar6;
  int iPtrEnd;
  uchar *data;
  u32 iEnd;
  ushort local_20;
  u16 x;
  u16 iOrigSize;
  u8 nFrag;
  u8 hdr;
  u16 iFreeBlk;
  u16 iPtr;
  u16 iSize_local;
  u16 iStart_local;
  MemPage *pPage_local;
  
  iEnd._2_1_ = 0;
  data._4_4_ = (uint)iStart + (uint)iSize;
  puVar2 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  x = bVar1 + 1;
  uVar3 = x;
  iOrigSize = iSize;
  _nFrag = iStart;
  if ((puVar2[(int)(x + 1)] == '\0') && (puVar2[x] == '\0')) {
    local_20 = 0;
  }
  else {
    do {
      x = uVar3;
      uVar4 = puVar2[(ulong)x + 1];
      local_20 = CONCAT11(puVar2[x],uVar4);
      if (iStart <= CONCAT11(puVar2[x],uVar4)) goto LAB_001668ac;
      uVar3 = local_20;
    } while (x + 4 <= (uint)local_20);
    if (local_20 != 0) {
      iVar6 = sqlite3CorruptError(0xfd93);
      return iVar6;
    }
LAB_001668ac:
    if (pPage->pBt->usableSize - 4 < (uint)local_20) {
      iVar6 = sqlite3CorruptError(0xfd98);
      return iVar6;
    }
    if ((local_20 != 0) && ((uint)local_20 <= data._4_4_ + 3)) {
      iEnd._2_1_ = uVar4 - (char)data._4_4_;
      if (local_20 < data._4_4_) {
        iVar6 = sqlite3CorruptError(0xfda4);
        return iVar6;
      }
      data._4_4_ = (uint)local_20 +
                   (uint)CONCAT11(puVar2[(int)(local_20 + 2)],puVar2[(long)(int)(local_20 + 2) + 1])
      ;
      if (pPage->pBt->usableSize < data._4_4_) {
        iVar6 = sqlite3CorruptError(0xfda7);
        return iVar6;
      }
      iOrigSize = (short)data._4_4_ - iStart;
      local_20 = CONCAT11(puVar2[local_20],puVar2[(ulong)local_20 + 1]);
    }
    if (((ushort)(bVar1 + 1) < x) &&
       (uVar5 = (uint)x + (uint)CONCAT11(puVar2[(int)(x + 2)],puVar2[(long)(int)(x + 2) + 1]),
       (uint)iStart <= uVar5 + 3)) {
      if (iStart < uVar5) {
        iVar6 = sqlite3CorruptError(0xfdb4);
        return iVar6;
      }
      iEnd._2_1_ = iEnd._2_1_ + ((char)iStart - (char)uVar5);
      iOrigSize = (short)data._4_4_ - x;
      _nFrag = x;
    }
    if (puVar2[(int)(bVar1 + 7)] < iEnd._2_1_) {
      iVar6 = sqlite3CorruptError(0xfdba);
      return iVar6;
    }
    puVar2[(int)(bVar1 + 7)] = puVar2[(int)(bVar1 + 7)] - iEnd._2_1_;
  }
  uVar4 = (u8)(local_20 >> 8);
  if (CONCAT11(puVar2[(int)(bVar1 + 5)],puVar2[(long)(int)(bVar1 + 5) + 1]) < _nFrag) {
    puVar2[x] = (u8)(_nFrag >> 8);
    puVar2[(ulong)x + 1] = (u8)_nFrag;
  }
  else {
    if ((_nFrag < CONCAT11(puVar2[(int)(bVar1 + 5)],puVar2[(long)(int)(bVar1 + 5) + 1])) ||
       (x != (u16)(bVar1 + 1))) {
      iVar6 = sqlite3CorruptError(0xfdc2);
      return iVar6;
    }
    puVar2[(int)(bVar1 + 1)] = uVar4;
    puVar2[(long)(int)(bVar1 + 1) + 1] = (u8)local_20;
    puVar2[(int)(bVar1 + 5)] = (u8)(data._4_4_ >> 8);
    puVar2[(long)(int)(bVar1 + 5) + 1] = (u8)data._4_4_;
  }
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + _nFrag,0,(ulong)iOrigSize);
  }
  puVar2[_nFrag] = uVar4;
  puVar2[(ulong)_nFrag + 1] = (u8)local_20;
  puVar2[(int)(_nFrag + 2)] = (u8)(iOrigSize >> 8);
  puVar2[(long)(int)(_nFrag + 2) + 1] = (u8)iOrigSize;
  pPage->nFree = (uint)iSize + pPage->nFree;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  x = get2byte(&data[hdr+5]);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x || iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}